

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O0

void __thiscall defyx::Instruction::h_IMUL_RCP(Instruction *this,ostream *os)

{
  byte bVar1;
  uint32_t uVar2;
  ostream *poVar3;
  void *this_00;
  ostream *in_RSI;
  long in_RDI;
  int dstIndex;
  
  bVar1 = *(byte *)(in_RDI + 1);
  poVar3 = std::operator<<(in_RSI,"r");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(uint)bVar1 % 8);
  poVar3 = std::operator<<(poVar3,", ");
  uVar2 = getImm32((Instruction *)0x117631);
  this_00 = (void *)std::ostream::operator<<(poVar3,uVar2);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void Instruction::h_IMUL_RCP(std::ostream& os) const {
		auto dstIndex = dst % RegistersCount;
		os << "r" << dstIndex << ", " << getImm32() << std::endl;
	}